

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

void StateParentGame(pyhanabi_state_t *state,pyhanabi_game_t *dest_game)

{
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x13b,"void StateParentGame(pyhanabi_state_t *, pyhanabi_game_t *)");
  }
  if ((undefined8 *)state->state != (undefined8 *)0x0) {
    if (dest_game != (pyhanabi_game_t *)0x0) {
      dest_game->game = *state->state;
      return;
    }
    __assert_fail("dest_game != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x13d,"void StateParentGame(pyhanabi_state_t *, pyhanabi_game_t *)");
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x13c,"void StateParentGame(pyhanabi_state_t *, pyhanabi_game_t *)");
}

Assistant:

void StateParentGame(pyhanabi_state_t* state, pyhanabi_game_t* dest_game) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  REQUIRE(dest_game != nullptr);
  dest_game->game =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->ParentGame();
}